

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_destroy_mutexes(void)

{
  int i;
  int m;
  int number_of_outstanding_locks;
  comex_group_t in_stack_00000094;
  bool local_d;
  int local_c;
  int local_8;
  int local_4;
  
  if ((l_state.num_mutexes != 0) && (l_state.mutexes == (int *)0x0)) {
    __assert_fail("0 == l_state.num_mutexes || NULL != l_state.mutexes",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7fb,"int comex_destroy_mutexes()");
  }
  comex_barrier(in_stack_00000094);
  do {
    comex_make_progress();
    local_4 = 0;
    for (local_8 = 0; local_8 < l_state.num_mutexes; local_8 = local_8 + 1) {
      if (-1 < l_state.mutexes[local_8]) {
        local_4 = local_4 + 1;
      }
    }
    local_d = l_state.lq_head != (comex_lock_t *)0x0 || 0 < local_4;
  } while (local_d);
  if (l_state.lq_head == (comex_lock_t *)0x0) {
    if (l_state.lq_tail != (comex_lock_t *)0x0) {
      __assert_fail("NULL == l_state.lq_tail",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x80e,"int comex_destroy_mutexes()");
    }
    local_c = 0;
    while( true ) {
      if (l_state.num_mutexes <= local_c) {
        l_state.num_mutexes = 0;
        _my_free((void *)0x1d3a6c);
        l_state.mutexes = (int *)0x0;
        return 0;
      }
      if (-1 < l_state.mutexes[local_c]) break;
      local_c = local_c + 1;
    }
    __assert_fail("l_state.mutexes[i] < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x813,"int comex_destroy_mutexes()");
  }
  __assert_fail("NULL == l_state.lq_head",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x80d,"int comex_destroy_mutexes()");
}

Assistant:

int comex_destroy_mutexes()
{
    int number_of_outstanding_locks = 0;

    /* make sure mutexes were previously created */
    assert(0 == l_state.num_mutexes || NULL != l_state.mutexes);

    /* fix race condition -- some procs reach destroy before servicing all
     * requests */
    comex_barrier(COMEX_GROUP_WORLD);

    /* you cannot free mutexes if one is in use or queued for use */
    do {
        int m;
        comex_make_progress();
        number_of_outstanding_locks = 0;
        for (m=0; m<l_state.num_mutexes; ++m) {
            if (l_state.mutexes[m] >= 0) {
                ++number_of_outstanding_locks;
            }
        }
    } while (l_state.lq_head || number_of_outstanding_locks > 0);

    assert(NULL == l_state.lq_head);
    assert(NULL == l_state.lq_tail);
#ifndef NDEBUG
    {
        int i;
        for (i=0; i<l_state.num_mutexes; ++i) {
            assert(l_state.mutexes[i] < 0);
        }
    }
#endif

    /* destroy mutex counts */
    l_state.num_mutexes = 0;

    /* destroy the mutexes */
    _my_free(l_state.mutexes);
    l_state.mutexes = NULL;

    return COMEX_SUCCESS;
}